

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_dependence.cpp
# Opt level: O3

bool __thiscall
spvtools::opt::LoopDependenceAnalysis::WeakZeroDestinationSIVTest
          (LoopDependenceAnalysis *this,SERecurrentNode *source,SENode *destination,
          SENode *coefficient,DistanceEntry *distance_entry)

{
  ScalarEvolutionAnalysis *pSVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  long value;
  int64_t bound_one;
  int64_t bound_two;
  bool bVar3;
  int iVar4;
  int iVar5;
  Loop *loop;
  SENode *pSVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  long value_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  SENode *pSVar7;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  long *plVar8;
  SENode *operand_2;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined8 *puVar9;
  ulong *puVar10;
  size_type *psVar11;
  long lVar12;
  ulong uVar13;
  undefined8 uVar14;
  pair<spvtools::opt::SENode_*,_spvtools::opt::SENode_*> subscript_pair;
  ulong *local_3b0;
  long local_3a8;
  ulong local_3a0;
  long lStack_398;
  string local_390;
  DistanceEntry *local_370;
  ulong *local_368;
  long local_360;
  ulong local_358;
  long lStack_350;
  ulong *local_348;
  long local_340;
  ulong local_338;
  long lStack_330;
  long local_328;
  SENode *local_320;
  string local_318;
  ScalarEvolutionAnalysis *local_2f8;
  SERecurrentNode *local_2f0;
  SENode *local_2e8;
  string local_2e0;
  string local_2c0;
  string local_2a0;
  string local_280;
  string local_260;
  string local_240;
  string local_220;
  string local_200;
  string local_1e0;
  string local_1c0;
  string local_1a0;
  string local_180;
  string local_160;
  string local_140;
  string local_120;
  string local_100;
  string local_e0;
  string local_c0;
  string local_a0;
  string local_80;
  string local_60;
  pair<spvtools::opt::SENode_*,_spvtools::opt::SENode_*> local_40;
  
  local_370 = distance_entry;
  local_2e8 = coefficient;
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_60,"Performing WeakZeroDestinationSIVTest.","");
  PrintDebug(this,&local_60);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  local_40.first = &source->super_SENode;
  local_40.second = destination;
  loop = GetLoopForSubscriptPair(this,&local_40);
  local_2f0 = source;
  pSVar6 = GetConstantTerm(this,loop,source);
  pSVar1 = &this->scalar_evolution_;
  local_320 = destination;
  pSVar6 = ScalarEvolutionAnalysis::CreateSubtraction(pSVar1,destination,pSVar6);
  local_2f8 = pSVar1;
  pSVar6 = ScalarEvolutionAnalysis::SimplifyExpression(pSVar1,pSVar6);
  iVar4 = (*pSVar6->_vptr_SENode[4])(pSVar6);
  iVar5 = (*local_2e8->_vptr_SENode[4])();
  if (CONCAT44(extraout_var_00,iVar5) == 0 || CONCAT44(extraout_var,iVar4) == 0) {
    local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_c0,
               "WeakZeroDestinationSIVTest was unable to fold delta and coefficient to constants.",
               "");
    PrintDebug(this,&local_c0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
      operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
    }
    value_00 = 0;
  }
  else {
    local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_80,
               "WeakZeroDestinationSIVTest folding delta and coefficient to constants.","");
    PrintDebug(this,&local_80);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != &local_80.field_2) {
      operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
    }
    lVar12 = *(long *)(CONCAT44(extraout_var,iVar4) + 0x30);
    value = *(long *)(CONCAT44(extraout_var_00,iVar5) + 0x30);
    value_00 = lVar12 / value;
    if (lVar12 % value != 0) {
      local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_a0,
                 "WeakZeroDestinationSIVTest proved independence through distance not being an integer."
                 ,"");
      PrintDebug(this,&local_a0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
        operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
      }
      local_370->dependence_information = DIRECTION;
      local_370->direction = NONE;
      return true;
    }
    ToString<long>(&local_2a0,this,lVar12);
    plVar8 = (long *)std::__cxx11::string::replace((ulong)&local_2a0,0,(char *)0x0,0x33f102);
    local_2c0._M_dataplus._M_p = (pointer)&local_2c0.field_2;
    psVar11 = (size_type *)(plVar8 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar8 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar11) {
      local_2c0.field_2._M_allocated_capacity = *psVar11;
      local_2c0.field_2._8_8_ = plVar8[3];
    }
    else {
      local_2c0.field_2._M_allocated_capacity = *psVar11;
      local_2c0._M_dataplus._M_p = (pointer)*plVar8;
    }
    local_2c0._M_string_length = plVar8[1];
    *plVar8 = (long)psVar11;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    plVar8 = (long *)std::__cxx11::string::append((char *)&local_2c0);
    puVar10 = (ulong *)(plVar8 + 2);
    if ((ulong *)*plVar8 == puVar10) {
      local_338 = *puVar10;
      lStack_330 = plVar8[3];
      local_348 = &local_338;
    }
    else {
      local_338 = *puVar10;
      local_348 = (ulong *)*plVar8;
    }
    local_340 = plVar8[1];
    *plVar8 = (long)puVar10;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    ToString<long>(&local_318,this,value);
    uVar13 = 0xf;
    if (local_348 != &local_338) {
      uVar13 = local_338;
    }
    if (uVar13 < local_318._M_string_length + local_340) {
      uVar14 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_318._M_dataplus._M_p != &local_318.field_2) {
        uVar14 = local_318.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar14 < local_318._M_string_length + local_340) goto LAB_00270331;
      puVar9 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_318,0,(char *)0x0,(ulong)local_348);
    }
    else {
LAB_00270331:
      puVar9 = (undefined8 *)
               std::__cxx11::string::_M_append((char *)&local_348,(ulong)local_318._M_dataplus._M_p)
      ;
    }
    local_368 = &local_358;
    puVar10 = puVar9 + 2;
    if ((ulong *)*puVar9 == puVar10) {
      local_358 = *puVar10;
      lStack_350 = puVar9[3];
    }
    else {
      local_358 = *puVar10;
      local_368 = (ulong *)*puVar9;
    }
    local_360 = puVar9[1];
    *puVar9 = puVar10;
    puVar9[1] = 0;
    *(undefined1 *)puVar10 = 0;
    plVar8 = (long *)std::__cxx11::string::append((char *)&local_368);
    paVar2 = &local_390.field_2;
    puVar10 = (ulong *)(plVar8 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar8 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar10) {
      local_390.field_2._M_allocated_capacity = *puVar10;
      local_390.field_2._8_8_ = plVar8[3];
      local_390._M_dataplus._M_p = (pointer)paVar2;
    }
    else {
      local_390.field_2._M_allocated_capacity = *puVar10;
      local_390._M_dataplus._M_p = (pointer)*plVar8;
    }
    local_390._M_string_length = plVar8[1];
    *plVar8 = (long)puVar10;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    ToString<long>(&local_280,this,value_00);
    uVar14 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_390._M_dataplus._M_p != paVar2) {
      uVar14 = local_390.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar14 < local_280._M_string_length + local_390._M_string_length) {
      uVar14 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_280._M_dataplus._M_p != &local_280.field_2) {
        uVar14 = local_280.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar14 < local_280._M_string_length + local_390._M_string_length)
      goto LAB_002706d4;
      puVar9 = (undefined8 *)
               std::__cxx11::string::replace
                         ((ulong)&local_280,0,(char *)0x0,(ulong)local_390._M_dataplus._M_p);
    }
    else {
LAB_002706d4:
      puVar9 = (undefined8 *)
               std::__cxx11::string::_M_append((char *)&local_390,(ulong)local_280._M_dataplus._M_p)
      ;
    }
    local_3b0 = &local_3a0;
    puVar10 = puVar9 + 2;
    if ((ulong *)*puVar9 == puVar10) {
      local_3a0 = *puVar10;
      lStack_398 = puVar9[3];
    }
    else {
      local_3a0 = *puVar10;
      local_3b0 = (ulong *)*puVar9;
    }
    local_3a8 = puVar9[1];
    *puVar9 = puVar10;
    puVar9[1] = 0;
    *(undefined1 *)puVar10 = 0;
    plVar8 = (long *)std::__cxx11::string::append((char *)&local_3b0);
    psVar11 = (size_type *)(plVar8 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar8 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar11) {
      local_220.field_2._M_allocated_capacity = *psVar11;
      local_220.field_2._8_8_ = plVar8[3];
      local_220._M_dataplus._M_p = (pointer)&local_220.field_2;
    }
    else {
      local_220.field_2._M_allocated_capacity = *psVar11;
      local_220._M_dataplus._M_p = (pointer)*plVar8;
    }
    local_220._M_string_length = plVar8[1];
    *plVar8 = (long)psVar11;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    PrintDebug(this,&local_220);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_220._M_dataplus._M_p != &local_220.field_2) {
      operator_delete(local_220._M_dataplus._M_p,local_220.field_2._M_allocated_capacity + 1);
    }
    if (local_3b0 != &local_3a0) {
      operator_delete(local_3b0,local_3a0 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_280._M_dataplus._M_p != &local_280.field_2) {
      operator_delete(local_280._M_dataplus._M_p,local_280.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_390._M_dataplus._M_p != paVar2) {
      operator_delete(local_390._M_dataplus._M_p,local_390.field_2._M_allocated_capacity + 1);
    }
    if (local_368 != &local_358) {
      operator_delete(local_368,local_358 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_318._M_dataplus._M_p != &local_318.field_2) {
      operator_delete(local_318._M_dataplus._M_p,local_318.field_2._M_allocated_capacity + 1);
    }
    if (local_348 != &local_338) {
      operator_delete(local_348,local_338 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2c0._M_dataplus._M_p != &local_2c0.field_2) {
      operator_delete(local_2c0._M_dataplus._M_p,local_2c0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2a0._M_dataplus._M_p != &local_2a0.field_2) {
      operator_delete(local_2a0._M_dataplus._M_p,local_2a0.field_2._M_allocated_capacity + 1);
    }
  }
  pSVar6 = GetLowerBound(this,loop);
  iVar4 = (*pSVar6->_vptr_SENode[4])(pSVar6);
  pSVar6 = GetUpperBound(this,loop);
  iVar5 = (*pSVar6->_vptr_SENode[4])(pSVar6);
  if (CONCAT44(extraout_var_02,iVar5) == 0 || CONCAT44(extraout_var_01,iVar4) == 0) {
    local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_120,
               "WeakZeroDestinationSIVTest was unable to find lower and upper bound as SEConstantNodes."
               ,"");
    PrintDebug(this,&local_120);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_120._M_dataplus._M_p != &local_120.field_2) {
      operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1);
    }
LAB_0026fdac:
    pSVar6 = GetFirstTripInductionNode(this,loop);
    pSVar7 = GetConstantTerm(this,loop,local_2f0);
    pSVar1 = local_2f8;
    pSVar6 = ScalarEvolutionAnalysis::CreateAddNode(local_2f8,pSVar6,pSVar7);
    pSVar6 = ScalarEvolutionAnalysis::SimplifyExpression(pSVar1,pSVar6);
    if (pSVar6 == (SENode *)0x0) {
      local_180._M_dataplus._M_p = (pointer)&local_180.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_180,
                 "WeakZeroDestinationSIVTest was unable to build first_trip_SENode","");
      PrintDebug(this,&local_180);
      pSVar7 = local_320;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_180._M_dataplus._M_p != &local_180.field_2) {
        operator_delete(local_180._M_dataplus._M_p,local_180.field_2._M_allocated_capacity + 1);
      }
    }
    else {
      local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_140,"WeakZeroDestinationSIVTest built first_trip_SENode.","");
      PrintDebug(this,&local_140);
      pSVar7 = local_320;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_140._M_dataplus._M_p != &local_140.field_2) {
        operator_delete(local_140._M_dataplus._M_p,local_140.field_2._M_allocated_capacity + 1);
      }
      iVar4 = (*pSVar6->_vptr_SENode[4])(pSVar6);
      if (CONCAT44(extraout_var_03,iVar4) != 0) {
        iVar4 = (*pSVar6->_vptr_SENode[4])(pSVar6);
        ToString<long>(&local_390,this,*(long *)(CONCAT44(extraout_var_04,iVar4) + 0x30));
        puVar9 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_390,0,(char *)0x0,0x33f300);
        puVar10 = puVar9 + 2;
        if ((ulong *)*puVar9 == puVar10) {
          local_3a0 = *puVar10;
          lStack_398 = puVar9[3];
          local_3b0 = &local_3a0;
        }
        else {
          local_3a0 = *puVar10;
          local_3b0 = (ulong *)*puVar9;
        }
        local_3a8 = puVar9[1];
        *puVar9 = puVar10;
        puVar9[1] = 0;
        *(undefined1 *)(puVar9 + 2) = 0;
        plVar8 = (long *)std::__cxx11::string::append((char *)&local_3b0);
        psVar11 = (size_type *)(plVar8 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar8 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar11) {
          local_240.field_2._M_allocated_capacity = *psVar11;
          local_240.field_2._8_8_ = plVar8[3];
          local_240._M_dataplus._M_p = (pointer)&local_240.field_2;
        }
        else {
          local_240.field_2._M_allocated_capacity = *psVar11;
          local_240._M_dataplus._M_p = (pointer)*plVar8;
        }
        local_240._M_string_length = plVar8[1];
        *plVar8 = (long)psVar11;
        plVar8[1] = 0;
        *(undefined1 *)(plVar8 + 2) = 0;
        PrintDebug(this,&local_240);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_240._M_dataplus._M_p != &local_240.field_2) {
          operator_delete(local_240._M_dataplus._M_p,local_240.field_2._M_allocated_capacity + 1);
        }
        pSVar7 = local_320;
        if (local_3b0 != &local_3a0) {
          operator_delete(local_3b0,local_3a0 + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_390._M_dataplus._M_p != &local_390.field_2) {
          operator_delete(local_390._M_dataplus._M_p,local_390.field_2._M_allocated_capacity + 1);
        }
      }
      if (pSVar6 == pSVar7) {
        local_160._M_dataplus._M_p = (pointer)&local_160.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_160,
                   "WeakZeroDestinationSIVTest has found peeling first iteration will break dependency"
                   ,"");
        PrintDebug(this,&local_160);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_160._M_dataplus._M_p != &local_160.field_2) {
          operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1);
        }
        local_370->dependence_information = PEEL;
        local_370->peel_first = true;
        return false;
      }
    }
    pSVar6 = GetFinalTripInductionNode(this,loop,local_2e8);
    operand_2 = GetConstantTerm(this,loop,local_2f0);
    pSVar1 = local_2f8;
    pSVar6 = ScalarEvolutionAnalysis::CreateAddNode(local_2f8,pSVar6,operand_2);
    pSVar6 = ScalarEvolutionAnalysis::SimplifyExpression(pSVar1,pSVar6);
    if (pSVar6 == (SENode *)0x0) {
      local_1e0._M_dataplus._M_p = (pointer)&local_1e0.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_1e0,
                 "WeakZeroDestinationSIVTest was unable to build final_trip_SENode","");
      PrintDebug(this,&local_1e0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
        operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1);
      }
    }
    else {
      local_1a0._M_dataplus._M_p = (pointer)&local_1a0.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_1a0,"WeakZeroDestinationSIVTest built final_trip_SENode.","");
      PrintDebug(this,&local_1a0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
        operator_delete(local_1a0._M_dataplus._M_p,local_1a0.field_2._M_allocated_capacity + 1);
      }
      iVar4 = (*pSVar6->_vptr_SENode[4])(pSVar6);
      if (CONCAT44(extraout_var_05,iVar4) != 0) {
        iVar4 = (*pSVar6->_vptr_SENode[4])(pSVar6);
        ToString<long>(&local_390,this,*(long *)(CONCAT44(extraout_var_06,iVar4) + 0x30));
        puVar9 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_390,0,(char *)0x0,0x33f421);
        puVar10 = puVar9 + 2;
        if ((ulong *)*puVar9 == puVar10) {
          local_3a0 = *puVar10;
          lStack_398 = puVar9[3];
          local_3b0 = &local_3a0;
        }
        else {
          local_3a0 = *puVar10;
          local_3b0 = (ulong *)*puVar9;
        }
        local_3a8 = puVar9[1];
        *puVar9 = puVar10;
        puVar9[1] = 0;
        *(undefined1 *)(puVar9 + 2) = 0;
        plVar8 = (long *)std::__cxx11::string::append((char *)&local_3b0);
        psVar11 = (size_type *)(plVar8 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar8 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar11) {
          local_260.field_2._M_allocated_capacity = *psVar11;
          local_260.field_2._8_8_ = plVar8[3];
          local_260._M_dataplus._M_p = (pointer)&local_260.field_2;
        }
        else {
          local_260.field_2._M_allocated_capacity = *psVar11;
          local_260._M_dataplus._M_p = (pointer)*plVar8;
        }
        local_260._M_string_length = plVar8[1];
        *plVar8 = (long)psVar11;
        plVar8[1] = 0;
        *(undefined1 *)(plVar8 + 2) = 0;
        PrintDebug(this,&local_260);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_260._M_dataplus._M_p != &local_260.field_2) {
          operator_delete(local_260._M_dataplus._M_p,local_260.field_2._M_allocated_capacity + 1);
        }
        if (local_3b0 != &local_3a0) {
          operator_delete(local_3b0,local_3a0 + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_390._M_dataplus._M_p != &local_390.field_2) {
          operator_delete(local_390._M_dataplus._M_p,local_390.field_2._M_allocated_capacity + 1);
        }
      }
      if (pSVar6 == pSVar7) {
        local_1c0._M_dataplus._M_p = (pointer)&local_1c0.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_1c0,
                   "WeakZeroDestinationSIVTest has found peeling final iteration will break dependency"
                   ,"");
        PrintDebug(this,&local_1c0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
          operator_delete(local_1c0._M_dataplus._M_p,local_1c0.field_2._M_allocated_capacity + 1);
        }
        local_370->dependence_information = PEEL;
        local_370->peel_last = true;
        return false;
      }
    }
    local_200._M_dataplus._M_p = (pointer)&local_200.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_200,
               "WeakZeroDestinationSIVTest was unable to determine any dependence information.","");
    PrintDebug(this,&local_200);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_200._M_dataplus._M_p != &local_200.field_2) {
      operator_delete(local_200._M_dataplus._M_p,local_200.field_2._M_allocated_capacity + 1);
    }
    local_370->direction = ALL;
    return false;
  }
  local_328 = value_00;
  local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_e0,"WeakZeroDestinationSIVTest found bounds as SEConstantNodes.","");
  PrintDebug(this,&local_e0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
    operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
  }
  bound_one = *(int64_t *)(CONCAT44(extraout_var_01,iVar4) + 0x30);
  bound_two = *(int64_t *)(CONCAT44(extraout_var_02,iVar5) + 0x30);
  lVar12 = -local_328;
  if (0 < local_328) {
    lVar12 = local_328;
  }
  bVar3 = IsWithinBounds(this,lVar12,bound_one,bound_two);
  if (bVar3) goto LAB_0026fdac;
  local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_100,
             "WeakZeroDestinationSIVTest proved independence through distance escaping the loop bounds."
             ,"");
  PrintDebug(this,&local_100);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100._M_dataplus._M_p != &local_100.field_2) {
    operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
  }
  ToString<long>(&local_2c0,this,bound_one);
  plVar8 = (long *)std::__cxx11::string::replace((ulong)&local_2c0,0,(char *)0x0,0x33f242);
  local_348 = &local_338;
  puVar10 = (ulong *)(plVar8 + 2);
  if ((ulong *)*plVar8 == puVar10) {
    local_338 = *puVar10;
    lStack_330 = plVar8[3];
  }
  else {
    local_338 = *puVar10;
    local_348 = (ulong *)*plVar8;
  }
  local_340 = plVar8[1];
  *plVar8 = (long)puVar10;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_348);
  puVar10 = (ulong *)(plVar8 + 2);
  if ((ulong *)*plVar8 == puVar10) {
    local_358 = *puVar10;
    lStack_350 = plVar8[3];
    local_368 = &local_358;
  }
  else {
    local_358 = *puVar10;
    local_368 = (ulong *)*plVar8;
  }
  local_360 = plVar8[1];
  *plVar8 = (long)puVar10;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  ToString<long>(&local_2a0,this,bound_two);
  uVar13 = 0xf;
  if (local_368 != &local_358) {
    uVar13 = local_358;
  }
  if (uVar13 < local_2a0._M_string_length + local_360) {
    uVar14 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2a0._M_dataplus._M_p != &local_2a0.field_2) {
      uVar14 = local_2a0.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar14 < local_2a0._M_string_length + local_360) goto LAB_00270418;
    puVar9 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_2a0,0,(char *)0x0,(ulong)local_368);
  }
  else {
LAB_00270418:
    puVar9 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_368,(ulong)local_2a0._M_dataplus._M_p);
  }
  local_390._M_dataplus._M_p = (pointer)&local_390.field_2;
  psVar11 = puVar9 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar9 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar11) {
    local_390.field_2._M_allocated_capacity = *psVar11;
    local_390.field_2._8_8_ = puVar9[3];
  }
  else {
    local_390.field_2._M_allocated_capacity = *psVar11;
    local_390._M_dataplus._M_p = (pointer)*puVar9;
  }
  local_390._M_string_length = puVar9[1];
  *puVar9 = psVar11;
  puVar9[1] = 0;
  *(undefined1 *)psVar11 = 0;
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_390);
  puVar10 = (ulong *)(plVar8 + 2);
  if ((ulong *)*plVar8 == puVar10) {
    local_3a0 = *puVar10;
    lStack_398 = plVar8[3];
    local_3b0 = &local_3a0;
  }
  else {
    local_3a0 = *puVar10;
    local_3b0 = (ulong *)*plVar8;
  }
  local_3a8 = plVar8[1];
  *plVar8 = (long)puVar10;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  ToString<long>(&local_318,this,local_328);
  uVar13 = 0xf;
  if (local_3b0 != &local_3a0) {
    uVar13 = local_3a0;
  }
  if (uVar13 < local_318._M_string_length + local_3a8) {
    uVar14 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_318._M_dataplus._M_p != &local_318.field_2) {
      uVar14 = local_318.field_2._M_allocated_capacity;
    }
    if (local_318._M_string_length + local_3a8 <= (ulong)uVar14) {
      puVar9 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_318,0,(char *)0x0,(ulong)local_3b0);
      goto LAB_002709f8;
    }
  }
  puVar9 = (undefined8 *)
           std::__cxx11::string::_M_append((char *)&local_3b0,(ulong)local_318._M_dataplus._M_p);
LAB_002709f8:
  local_2e0._M_dataplus._M_p = (pointer)&local_2e0.field_2;
  psVar11 = puVar9 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar9 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar11) {
    local_2e0.field_2._M_allocated_capacity = *psVar11;
    local_2e0.field_2._8_8_ = puVar9[3];
  }
  else {
    local_2e0.field_2._M_allocated_capacity = *psVar11;
    local_2e0._M_dataplus._M_p = (pointer)*puVar9;
  }
  local_2e0._M_string_length = puVar9[1];
  *puVar9 = psVar11;
  puVar9[1] = 0;
  *(undefined1 *)psVar11 = 0;
  PrintDebug(this,&local_2e0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2e0._M_dataplus._M_p != &local_2e0.field_2) {
    operator_delete(local_2e0._M_dataplus._M_p,local_2e0.field_2._M_allocated_capacity + 1);
  }
  lVar12 = local_328;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_318._M_dataplus._M_p != &local_318.field_2) {
    operator_delete(local_318._M_dataplus._M_p,local_318.field_2._M_allocated_capacity + 1);
  }
  if (local_3b0 != &local_3a0) {
    operator_delete(local_3b0,local_3a0 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_390._M_dataplus._M_p != &local_390.field_2) {
    operator_delete(local_390._M_dataplus._M_p,local_390.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a0._M_dataplus._M_p != &local_2a0.field_2) {
    operator_delete(local_2a0._M_dataplus._M_p,local_2a0.field_2._M_allocated_capacity + 1);
  }
  if (local_368 != &local_358) {
    operator_delete(local_368,local_358 + 1);
  }
  if (local_348 != &local_338) {
    operator_delete(local_348,local_338 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2c0._M_dataplus._M_p != &local_2c0.field_2) {
    operator_delete(local_2c0._M_dataplus._M_p,local_2c0.field_2._M_allocated_capacity + 1);
  }
  local_370->dependence_information = DISTANCE;
  local_370->direction = NONE;
  local_370->distance = lVar12;
  return true;
}

Assistant:

bool LoopDependenceAnalysis::WeakZeroDestinationSIVTest(
    SERecurrentNode* source, SENode* destination, SENode* coefficient,
    DistanceEntry* distance_entry) {
  PrintDebug("Performing WeakZeroDestinationSIVTest.");
  // Build an SENode for distance.
  std::pair<SENode*, SENode*> subscript_pair =
      std::make_pair(source, destination);
  const Loop* subscript_loop = GetLoopForSubscriptPair(subscript_pair);
  SENode* source_constant_term = GetConstantTerm(subscript_loop, source);
  SENode* delta = scalar_evolution_.SimplifyExpression(
      scalar_evolution_.CreateSubtraction(destination, source_constant_term));

  // Scalar evolution doesn't perform division, so we must fold to constants and
  // do it manually.
  int64_t distance = 0;
  SEConstantNode* delta_constant = delta->AsSEConstantNode();
  SEConstantNode* coefficient_constant = coefficient->AsSEConstantNode();
  if (delta_constant && coefficient_constant) {
    PrintDebug(
        "WeakZeroDestinationSIVTest folding delta and coefficient to "
        "constants.");
    int64_t delta_value = delta_constant->FoldToSingleValue();
    int64_t coefficient_value = coefficient_constant->FoldToSingleValue();
    // Check if the distance is not integral.
    if (delta_value % coefficient_value != 0) {
      PrintDebug(
          "WeakZeroDestinationSIVTest proved independence through distance not "
          "being an integer.");
      distance_entry->dependence_information =
          DistanceEntry::DependenceInformation::DIRECTION;
      distance_entry->direction = DistanceEntry::Directions::NONE;
      return true;
    } else {
      distance = delta_value / coefficient_value;
      PrintDebug(
          "WeakZeroDestinationSIVTest calculated distance with the following "
          "values\n"
          "\tdelta value: " +
          ToString(delta_value) +
          "\n\tcoefficient value: " + ToString(coefficient_value) +
          "\n\tdistance: " + ToString(distance) + "\n");
    }
  } else {
    PrintDebug(
        "WeakZeroDestinationSIVTest was unable to fold delta and coefficient "
        "to constants.");
  }

  // If we can prove the distance is outside the bounds we prove independence.
  SEConstantNode* lower_bound =
      GetLowerBound(subscript_loop)->AsSEConstantNode();
  SEConstantNode* upper_bound =
      GetUpperBound(subscript_loop)->AsSEConstantNode();
  if (lower_bound && upper_bound) {
    PrintDebug("WeakZeroDestinationSIVTest found bounds as SEConstantNodes.");
    int64_t lower_bound_value = lower_bound->FoldToSingleValue();
    int64_t upper_bound_value = upper_bound->FoldToSingleValue();
    if (!IsWithinBounds(llabs(distance), lower_bound_value,
                        upper_bound_value)) {
      PrintDebug(
          "WeakZeroDestinationSIVTest proved independence through distance "
          "escaping the loop bounds.");
      PrintDebug(
          "Bound values were as follows\n"
          "\tlower bound value: " +
          ToString(lower_bound_value) +
          "\n\tupper bound value: " + ToString(upper_bound_value) +
          "\n\tdistance value: " + ToString(distance));
      distance_entry->dependence_information =
          DistanceEntry::DependenceInformation::DISTANCE;
      distance_entry->direction = DistanceEntry::Directions::NONE;
      distance_entry->distance = distance;
      return true;
    }
  } else {
    PrintDebug(
        "WeakZeroDestinationSIVTest was unable to find lower and upper bound "
        "as SEConstantNodes.");
  }

  // Now we want to see if we can detect to peel the first or last iterations.

  // We get the FirstTripValue as GetFirstTripInductionNode() +
  // GetConstantTerm(source)
  SENode* first_trip_SENode = scalar_evolution_.SimplifyExpression(
      scalar_evolution_.CreateAddNode(GetFirstTripInductionNode(subscript_loop),
                                      GetConstantTerm(subscript_loop, source)));

  // If destination == FirstTripValue, peel_first.
  if (first_trip_SENode) {
    PrintDebug("WeakZeroDestinationSIVTest built first_trip_SENode.");
    if (first_trip_SENode->AsSEConstantNode()) {
      PrintDebug(
          "WeakZeroDestinationSIVTest has found first_trip_SENode as an "
          "SEConstantNode with value: " +
          ToString(first_trip_SENode->AsSEConstantNode()->FoldToSingleValue()) +
          "\n");
    }
    if (destination == first_trip_SENode) {
      // We have found that peeling the first iteration will break dependency.
      PrintDebug(
          "WeakZeroDestinationSIVTest has found peeling first iteration will "
          "break dependency");
      distance_entry->dependence_information =
          DistanceEntry::DependenceInformation::PEEL;
      distance_entry->peel_first = true;
      return false;
    }
  } else {
    PrintDebug(
        "WeakZeroDestinationSIVTest was unable to build first_trip_SENode");
  }

  // We get the LastTripValue as GetFinalTripInductionNode(coefficient) +
  // GetConstantTerm(source)
  SENode* final_trip_SENode =
      scalar_evolution_.SimplifyExpression(scalar_evolution_.CreateAddNode(
          GetFinalTripInductionNode(subscript_loop, coefficient),
          GetConstantTerm(subscript_loop, source)));

  // If destination == LastTripValue, peel_last.
  if (final_trip_SENode) {
    PrintDebug("WeakZeroDestinationSIVTest built final_trip_SENode.");
    if (final_trip_SENode->AsSEConstantNode()) {
      PrintDebug(
          "WeakZeroDestinationSIVTest has found final_trip_SENode as an "
          "SEConstantNode with value: " +
          ToString(final_trip_SENode->AsSEConstantNode()->FoldToSingleValue()) +
          "\n");
    }
    if (destination == final_trip_SENode) {
      // We have found that peeling the last iteration will break dependency.
      PrintDebug(
          "WeakZeroDestinationSIVTest has found peeling final iteration will "
          "break dependency");
      distance_entry->dependence_information =
          DistanceEntry::DependenceInformation::PEEL;
      distance_entry->peel_last = true;
      return false;
    }
  } else {
    PrintDebug(
        "WeakZeroDestinationSIVTest was unable to build final_trip_SENode");
  }

  // We were unable to prove independence or discern any additional information.
  // Must assume <=> direction.
  PrintDebug(
      "WeakZeroDestinationSIVTest was unable to determine any dependence "
      "information.");
  distance_entry->direction = DistanceEntry::Directions::ALL;
  return false;
}